

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt-slab-alloc.c
# Opt level: O1

void * ztslaballoc(size_t n,void *opaque)

{
  long lVar1;
  void *pvVar2;
  ulong __size;
  long lVar3;
  
  __size = n + 7 & 0xfffffffffffffff8;
  if (3999 < n + 7) {
    pvVar2 = malloc(__size);
    return pvVar2;
  }
  if (*(ulong *)((long)opaque + 0x18) < __size) {
    if (*(long *)((long)opaque + 8) == *(long *)((long)opaque + 0x10)) {
      lVar1 = *(long *)((long)opaque + 0x10) * 2;
      lVar3 = 4;
      if (lVar1 != 0) {
        lVar3 = lVar1;
      }
      pvVar2 = realloc(*opaque,lVar3 * 8);
      if (pvVar2 != (void *)0x0) {
        *(void **)opaque = pvVar2;
        *(long *)((long)opaque + 0x10) = lVar3;
        goto LAB_00103980;
      }
    }
    else {
LAB_00103980:
      pvVar2 = malloc(4000);
      if (pvVar2 != (void *)0x0) {
        lVar1 = *(long *)((long)opaque + 8);
        *(long *)((long)opaque + 8) = lVar1 + 1;
        *(void **)(*opaque + lVar1 * 8) = pvVar2;
        *(undefined8 *)((long)opaque + 0x18) = 4000;
        goto LAB_001039aa;
      }
    }
    pvVar2 = (void *)0x0;
  }
  else {
LAB_001039aa:
    pvVar2 = (void *)((*(long *)(*opaque + -8 + *(long *)((long)opaque + 8) * 8) -
                      *(long *)((long)opaque + 0x18)) + 4000);
    *(ulong *)((long)opaque + 0x18) = *(long *)((long)opaque + 0x18) - __size;
    *(long *)((long)opaque + 0x20) = *(long *)((long)opaque + 0x20) + 1;
    *(long *)((long)opaque + 0x28) = *(long *)((long)opaque + 0x28) + 1;
    *(long *)((long)opaque + 0x30) = *(long *)((long)opaque + 0x30) + __size;
  }
  return pvVar2;
}

Assistant:

void *ztslaballoc(size_t n, void *opaque)
{
  ztslaballoc_t *sa = opaque;
  char          *p;

  /* round block sizes up to multiple of SLAB_ALIGN */
  n = (n + SLAB_ALIGN - 1) & ~(SLAB_ALIGN - 1);

  if (n >= SLAB_SIZE)
    return malloc(n);

  if (sa->remaining < n)
  {
    void *newslab;

    if (sa->nslablistused == sa->nslablistalloced)
    {
      size_t alloced;
      void **newlist;

      alloced = sa->nslablistalloced * 2; /* doubling strategy */
      if (alloced <= 0)
        alloced = 4;
      newlist = realloc(sa->slablist, alloced * sizeof(*newlist));
      if (newlist == NULL)
        return NULL;

      sa->slablist         = newlist;
      sa->nslablistalloced = alloced;
    }

    newslab = malloc(SLAB_SIZE);
    if (newslab == NULL)
      return NULL;

    sa->slablist[sa->nslablistused++] = newslab;

    sa->remaining = SLAB_SIZE;
  }

  p = sa->slablist[sa->nslablistused - 1];
  p += SLAB_SIZE - sa->remaining;
  sa->remaining -= n;

  sa->total_allocs++;
  sa->current_allocs++;
  sa->total_allocated += n;

  return p;
}